

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTargetPropertiesCommand.cxx
# Opt level: O1

bool cmSetTargetPropertiesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *this;
  bool bVar3;
  cmTarget *this_00;
  string *prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool bVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_98;
  size_type local_80;
  pointer local_78;
  undefined8 local_70;
  string *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar2 - (long)pbVar1) < 0x21) {
    local_98.first._M_len = (size_t)&local_98.second;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[11]>>
                         (pbVar1,pbVar2,"PROPERTIES");
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((local_58 == pbVar4) || (local_60 = local_58 + 1, local_60 == pbVar4)) {
      local_98.first._M_len = (size_t)&local_98.second;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,
                 "called with illegal arguments, maybe missing a PROPERTIES specifier?","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      if (((long)pbVar4 - (long)local_58 >> 5 & 0x8000000000000001U) == 1) {
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar5 = pbVar4 == local_58;
        if (bVar5) {
          return bVar5;
        }
        this = status->Makefile;
        local_68 = (string *)&status->Error;
        while( true ) {
          bVar3 = cmMakefile::IsAlias(this,pbVar4);
          if (bVar3) {
            local_98.first._M_len = (size_t)&local_98.second;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,"can not be used on an ALIAS target.","");
            std::__cxx11::string::_M_assign(local_68);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                local_98.first._M_len == &local_98.second) {
              return bVar5;
            }
            operator_delete((void *)local_98.first._M_len,
                            (ulong)((long)&((local_98.second)->_M_dataplus)._M_p + 1));
            return bVar5;
          }
          this_00 = cmMakefile::FindTargetToUse(this,pbVar4,false);
          if (this_00 == (cmTarget *)0x0) {
            local_98.first._M_len = 0x2a;
            local_98.first._M_str = "Can not find target to add properties to: ";
            local_98.second =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_78 = (pbVar4->_M_dataplus)._M_p;
            local_80 = pbVar4->_M_string_length;
            local_70 = 0;
            views._M_len = 2;
            views._M_array = &local_98;
            cmCatViews(&local_50,views);
            std::__cxx11::string::_M_assign(local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            prop = local_60;
            if (local_60 !=
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              do {
                cmTarget::SetProperty(this_00,prop,prop + 1);
                cmTarget::CheckProperty(this_00,prop,this);
                prop = prop + 2;
              } while (prop != (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          if (this_00 == (cmTarget *)0x0) break;
          pbVar4 = pbVar4 + 1;
          bVar5 = pbVar4 == local_58;
          if (bVar5) {
            return bVar5;
          }
        }
        return bVar5;
      }
      local_98.first._M_len = (size_t)&local_98.second;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"called with incorrect number of arguments.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_98.first._M_len !=
      &local_98.second) {
    operator_delete((void *)local_98.first._M_len,
                    (ulong)((long)&((local_98.second)->_M_dataplus)._M_p + 1));
  }
  return false;
}

Assistant:

bool cmSetTargetPropertiesCommand(std::vector<std::string> const& args,
                                  cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // first identify the properties arguments
  auto propsIter = std::find(args.begin(), args.end(), "PROPERTIES");
  if (propsIter == args.end() || propsIter + 1 == args.end()) {
    status.SetError("called with illegal arguments, maybe missing a "
                    "PROPERTIES specifier?");
    return false;
  }

  if (std::distance(propsIter, args.end()) % 2 != 1) {
    status.SetError("called with incorrect number of arguments.");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // loop over all the targets
  for (const std::string& tname : cmStringRange{ args.begin(), propsIter }) {
    if (mf.IsAlias(tname)) {
      status.SetError("can not be used on an ALIAS target.");
      return false;
    }
    if (cmTarget* target = mf.FindTargetToUse(tname)) {
      // loop through all the props and set them
      for (auto k = propsIter + 1; k != args.end(); k += 2) {
        target->SetProperty(*k, *(k + 1));
        target->CheckProperty(*k, &mf);
      }
    } else {
      status.SetError(
        cmStrCat("Can not find target to add properties to: ", tname));
      return false;
    }
  }
  return true;
}